

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::IsConcatSpreadable(Var instanceVar)

{
  ScriptContext *requestContext;
  Type *type;
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *propertyObject;
  RecyclableObject *aValue;
  IsConcatSpreadableCache *this;
  RecyclableObject *local_38;
  Var spreadable;
  
  BVar2 = IsObject(instanceVar);
  if (BVar2 == 0) {
    return 0;
  }
  propertyObject = UnsafeVarTo<Js::RecyclableObject>(instanceVar);
  requestContext =
       (((((propertyObject->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,IsConcatSpreadableCachePhase);
  if (bVar1) {
    aValue = (RecyclableObject *)
             GetProperty(propertyObject,0x13,requestContext,(PropertyValueInfo *)0x0);
    if (aValue != (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr) {
      BVar2 = JavascriptConversion::ToBoolean(aValue,requestContext);
      return BVar2;
    }
  }
  else {
    spreadable._4_4_ = 0;
    type = (propertyObject->type).ptr;
    this = &requestContext->threadContext->isConcatSpreadableCache;
    bVar1 = IsConcatSpreadableCache::TryGetIsConcatSpreadable
                      (this,type,(BOOL *)((long)&spreadable + 4));
    if (bVar1) {
      Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache hit: %p\n",type);
      return spreadable._4_4_;
    }
    local_38 = (RecyclableObject *)0x0;
    BVar2 = GetProperty(propertyObject,propertyObject,0x13,&local_38,requestContext,
                        (PropertyValueInfo *)0x0);
    if (BVar2 == 0) {
      bVar1 = IsArray(propertyObject);
      spreadable._4_4_ = (uint)bVar1;
      Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache saved: %p\n",type);
      IsConcatSpreadableCache::CacheIsConcatSpreadable(this,type,spreadable._4_4_);
      return spreadable._4_4_;
    }
    if (local_38 !=
        (((requestContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
        .undefinedValue.ptr) {
      BVar2 = JavascriptConversion::ToBoolean(local_38,requestContext);
      return BVar2;
    }
  }
  bVar1 = IsArray(propertyObject);
  return (uint)bVar1;
}

Assistant:

BOOL JavascriptOperators::IsConcatSpreadable(Var instanceVar)
    {
        // an object is spreadable under two condition, either it is a JsArray
        // or you define an isconcatSpreadable flag on it.
        if (!JavascriptOperators::IsObject(instanceVar))
        {
            return false;
        }

        RecyclableObject* instance = UnsafeVarTo<RecyclableObject>(instanceVar);
        ScriptContext* scriptContext = instance->GetScriptContext();

        if (!PHASE_OFF1(IsConcatSpreadableCachePhase))
        {
            BOOL retVal = FALSE;
            Type *instanceType = instance->GetType();
            IsConcatSpreadableCache *isConcatSpreadableCache = scriptContext->GetThreadContext()->GetIsConcatSpreadableCache();

            if (isConcatSpreadableCache->TryGetIsConcatSpreadable(instanceType, &retVal))
            {
                OUTPUT_TRACE(Phase::IsConcatSpreadableCachePhase, _u("IsConcatSpreadableCache hit: %p\n"), instanceType);
                return retVal;
            }

            Var spreadable = nullptr;
            BOOL hasUserDefinedSpreadable = JavascriptOperators::GetProperty(instance, instance, PropertyIds::_symbolIsConcatSpreadable, &spreadable, scriptContext);

            if (hasUserDefinedSpreadable && spreadable != scriptContext->GetLibrary()->GetUndefined())
            {
                return JavascriptConversion::ToBoolean(spreadable, scriptContext);
            }

            retVal = JavascriptOperators::IsArray(instance);

            if (!hasUserDefinedSpreadable)
            {
                OUTPUT_TRACE(Phase::IsConcatSpreadableCachePhase, _u("IsConcatSpreadableCache saved: %p\n"), instanceType);
                isConcatSpreadableCache->CacheIsConcatSpreadable(instanceType, retVal);
            }

            return retVal;
        }

        Var spreadable = JavascriptOperators::GetProperty(instance, PropertyIds::_symbolIsConcatSpreadable, scriptContext);
        if (spreadable != scriptContext->GetLibrary()->GetUndefined())
        {
            return JavascriptConversion::ToBoolean(spreadable, scriptContext);
        }

        return JavascriptOperators::IsArray(instance);
    }